

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall Js::ByteCodeWriter::EndSubexpression(ByteCodeWriter *this,ParseNode *node)

{
  charcount_t cVar1;
  SubexpressionNode *pSVar2;
  ScriptContext *pSVar3;
  StatementMap *pStatementMap;
  SubexpressionNode SVar4;
  
  if ((this->m_isInDebugMode == true) &&
     ((this->m_subexpressionNodesStack->list).
      super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
      .count != 0)) {
    pSVar2 = JsUtil::
             Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
             ::Peek(this->m_subexpressionNodesStack,0);
    if ((pSVar2->node == node) && ((this->m_byteCodeData).currentOffset != this->m_beginCodeSpan)) {
      pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)this->m_functionWrite);
      pStatementMap = FunctionBody::StatementMap::New(pSVar3->recycler);
      if (pStatementMap != (StatementMap *)0x0) {
        cVar1 = node->ichLim;
        (pStatementMap->sourceSpan).begin = node->ichMin;
        (pStatementMap->sourceSpan).end = cVar1;
        SVar4 = JsUtil::
                Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
                ::Pop(this->m_subexpressionNodesStack);
        (pStatementMap->byteCodeSpan).begin = SVar4.beginCodeSpan;
        (pStatementMap->byteCodeSpan).end = (this->m_byteCodeData).currentOffset - 1;
        pStatementMap->isSubexpression = true;
        FunctionBody::RecordStatementMap(this->m_functionWrite,pStatementMap);
        return;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::EndSubexpression(ParseNode* node)
    {
        if (!m_isInDebugMode || m_subexpressionNodesStack->Empty() || m_subexpressionNodesStack->Peek().node != node)
        {
            return;
        }

        if (m_byteCodeData.GetCurrentOffset() != m_beginCodeSpan)
        {
            FunctionBody::StatementMap* pCurrentStatement = FunctionBody::StatementMap::New(this->m_functionWrite->GetScriptContext()->GetRecycler());

            if (pCurrentStatement)
            {
                pCurrentStatement->sourceSpan.begin = node->ichMin;
                pCurrentStatement->sourceSpan.end = node->ichLim;

                SubexpressionNode subexpressionNode = m_subexpressionNodesStack->Pop();
                pCurrentStatement->byteCodeSpan.begin = subexpressionNode.beginCodeSpan;
                pCurrentStatement->byteCodeSpan.end = m_byteCodeData.GetCurrentOffset() - 1;
                pCurrentStatement->isSubexpression = true;

                m_functionWrite->RecordStatementMap(pCurrentStatement);
            }
        }
    }